

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t match_flags)

{
  char *__s;
  int iVar1;
  int iVar2;
  size_type sVar3;
  size_type __pos1;
  long lVar4;
  precise_unit pVar5;
  string local_b8;
  string cString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVar5._8_8_ = un;
  pVar5.multiplier_ = *(double *)this;
  to_string_internal_abi_cxx11_(&local_b8,*(units **)(this + 8),pVar5,match_flags);
  iVar2 = *(int *)(this + 0xc);
  for (lVar4 = 0; lVar4 != 0x108; lVar4 = lVar4 + 0x18) {
    __s = *(char **)(&DAT_0046b798 + lVar4);
    sVar3 = 0;
    while (sVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_b8,__s,sVar3), sVar3 != 0xffffffffffffffff) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 sVar3,(long)*(int *)((long)&DAT_0046b78c + lVar4),
                 *(char **)((long)&PTR_anon_var_dwarf_16e69a2_0046b790 + lVar4));
      sVar3 = sVar3 + (long)*(int *)((long)&clean_unit_string(std::__cxx11::string,unsigned_int)::
                                            powerseq + lVar4);
    }
  }
  if (local_b8._M_string_length != 0) {
    if (((*local_b8._M_dataplus._M_p == '(') &&
        (local_b8._M_dataplus._M_p[local_b8._M_string_length - 1] == ')')) &&
       (sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,'(',1), sVar3 == 0xffffffffffffffff)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_b8,(__const_iterator)local_b8._M_dataplus._M_p);
    }
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 "00000",0);
    if (sVar3 != 0xffffffffffffffff) {
      reduce_number_length(&local_b8,'0');
    }
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 "99999",0);
    if (sVar3 != 0xffffffffffffffff) {
      reduce_number_length(&local_b8,'9');
    }
  }
  if (iVar2 == 0) {
    if ((local_b8._M_string_length != 0) && (9 < (byte)(*local_b8._M_dataplus._M_p - 0x30U))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0])
        ;
      }
      goto LAB_003137e2;
    }
  }
  else {
    getCommodityName_abi_cxx11_(0x3134a9);
    iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString,0,
                    7,"CXCOMM[");
    if (iVar1 != 0) {
      sVar3 = 0;
      do {
        sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cString,"{}[]()",sVar3);
        if (sVar3 == 0) {
LAB_00313502:
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString,sVar3
                 ,1,'\\');
          sVar3 = sVar3 + 1;
        }
        else {
          if (sVar3 == 0xffffffffffffffff) break;
          if (cString._M_dataplus._M_p[sVar3 - 1] != '\\') goto LAB_00313502;
        }
        sVar3 = sVar3 + 1;
      } while( true );
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString,
               (__const_iterator)cString._M_dataplus._M_p,'{');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString,'}');
    if (iVar2 < 0) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                        (&local_b8,'/',0xffffffffffffffff);
      if (sVar3 == 0xffffffffffffffff) {
        pVar5 = checkForCustomUnit(&cString);
        if (pVar5.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar5.multiplier_)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString,0,1,
                 '1');
        }
        if (local_b8._M_string_length == 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                    '1');
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,'/'
                 );
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString);
      }
      else {
        __pos1 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_b8,"^*",0xffffffffffffffff);
        if (__pos1 == 0xffffffffffffffff || __pos1 < sVar3) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 __pos1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &cString);
        }
      }
    }
    else {
      sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b8,"/^",0xffffffffffffffff);
      if (sVar3 == 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString);
      }
      else {
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_b8,0,2,"1/");
        if (iVar2 == 0) {
          pVar5 = checkForCustomUnit(&cString);
          if (pVar5.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar5.multiplier_)) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString,0,1
                   ,'1');
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,0,1
                  ,cString._M_dataplus._M_p);
        }
        else {
          sVar3 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_b8,"^*/",0);
          if ((local_b8._M_dataplus._M_p[sVar3] == '^') &&
             (local_b8._M_dataplus._M_p[sVar3 + 1] == '-')) {
            pVar5 = checkForCustomUnit(&cString);
            if (pVar5.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar5.multiplier_)) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cString,0
                     ,1,'1');
            }
            std::operator+(&local_70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cString,"*");
            std::operator+(&local_50,&local_70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b8);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8
                      ,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                   sVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cString);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&cString);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
  }
LAB_003137e2:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const precise_unit& un, std::uint64_t match_flags)
{
    return clean_unit_string(
        to_string_internal(un, match_flags), un.commodity());
}